

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::UseInventory(AActor *this,AInventory *item)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  
  if (((this->health < 1) || (item->Amount < 1)) ||
     (((item->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar2 = AInventory::CallUse(item,false);
    if ((bVar2) && (bVar3 = true, (dmflags2.Value._2_1_ & 1) == 0)) {
      iVar1 = item->Amount;
      item->Amount = iVar1 + -1;
      if (iVar1 < 2) {
        (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(item);
      }
    }
  }
  return bVar3;
}

Assistant:

bool AActor::UseInventory (AInventory *item)
{
	// No using items if you're dead.
	if (health <= 0)
	{
		return false;
	}
	// Don't use it if you don't actually have any of it.
	if (item->Amount <= 0 || (item->ObjectFlags & OF_EuthanizeMe))
	{
		return false;
	}
	if (!item->CallUse (false))
	{
		return false;
	}

	if (dmflags2 & DF2_INFINITE_INVENTORY)
		return true;

	if (--item->Amount <= 0)
	{
		item->DepleteOrDestroy ();
	}
	return true;
}